

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O1

char * __thiscall llvm::DataExtractor::getCStr(DataExtractor *this,uint64_t *offset_ptr)

{
  ulong uVar1;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  size_t __n;
  char *pcVar5;
  
  uVar1 = *offset_ptr;
  uVar2 = (this->Data).Length;
  __n = uVar2 - uVar1;
  if (uVar1 <= uVar2 && __n != 0) {
    pcVar5 = (this->Data).Data;
    pvVar3 = memchr(pcVar5 + uVar1,0,__n);
    if (pvVar3 != (void *)0x0) {
      lVar4 = (long)pvVar3 - (long)pcVar5;
      goto LAB_00d4f864;
    }
  }
  lVar4 = -1;
LAB_00d4f864:
  if (lVar4 == -1) {
    pcVar5 = (char *)0x0;
  }
  else {
    *offset_ptr = lVar4 + 1;
    pcVar5 = (this->Data).Data + uVar1;
  }
  return pcVar5;
}

Assistant:

const char *DataExtractor::getCStr(uint64_t *offset_ptr) const {
  uint64_t offset = *offset_ptr;
  StringRef::size_type pos = Data.find('\0', offset);
  if (pos != StringRef::npos) {
    *offset_ptr = pos + 1;
    return Data.data() + offset;
  }
  return nullptr;
}